

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::fillInteractionData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2,bool newAtom1)

{
  byte bVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  value_type *in_RSI;
  long *in_RDI;
  byte in_R8B;
  SquareMatrix3<double> *in_stack_ffffffffffffffc8;
  value_type in_stack_ffffffffffffffd0;
  value_type in_stack_ffffffffffffffd4;
  
  bVar1 = (**(code **)(*in_RDI + 0xf0))(in_RDI,in_EDX,in_ECX);
  *(byte *)(in_RSI + 0x13) = bVar1 & 1;
  if ((in_R8B & 1) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)in_ECX);
    in_RSI[1] = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_EDX);
    if ((*pvVar2 < 0) ||
       (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_ECX),
       *pvVar2 < 0)) {
      *(undefined1 *)((long)in_RSI + 0x4d) = 0;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_EDX);
      in_stack_ffffffffffffffd0 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_ECX);
      *(bool *)((long)in_RSI + 0x4d) = in_stack_ffffffffffffffd0 == *pvVar2;
    }
    if ((*(uint *)(in_RDI + 6) & 8) != 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x48),(long)in_ECX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x20) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0x78),(long)in_ECX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x400) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0xf0),(long)in_ECX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x800) != 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x108),(long)in_ECX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x80) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xa8),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xb2) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x100) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xc0),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xb6) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x200) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xd8),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xba) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x40) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x90),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0x48) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x2000) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x138),
                          (long)in_ECX);
      *(value_type *)(in_RSI + 0xd2) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x4000) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x150),
                          (long)in_ECX);
      *(value_type *)(in_RSI + 0xbe) = *pvVar3;
    }
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)in_EDX);
    *in_RSI = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)in_ECX);
    in_RSI[1] = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_EDX);
    if ((*pvVar2 < 0) ||
       (pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_ECX),
       *pvVar2 < 0)) {
      *(undefined1 *)((long)in_RSI + 0x4d) = 0;
    }
    else {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_EDX);
      in_stack_ffffffffffffffd4 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf),(long)in_ECX);
      *(bool *)((long)in_RSI + 0x4d) = in_stack_ffffffffffffffd4 == *pvVar2;
    }
    if ((*(uint *)(in_RDI + 6) & 8) != 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x48),(long)in_EDX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x48),(long)in_ECX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x20) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0x78),(long)in_EDX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0x78),(long)in_ECX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x400) != 0) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0xf0),(long)in_EDX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI[3] + 0xf0),(long)in_ECX);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (Vector3<double> *)in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x800) != 0) {
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x108),(long)in_EDX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI[3] + 0x108),(long)in_ECX);
      SquareMatrix3<double>::operator=
                ((SquareMatrix3<double> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
    if ((*(uint *)(in_RDI + 6) & 0x80) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xa8),(long)in_EDX
                         );
      *(value_type *)(in_RSI + 0xb0) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xa8),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xb2) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x100) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xc0),(long)in_EDX
                         );
      *(value_type *)(in_RSI + 0xb4) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xc0),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xb6) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x200) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xd8),(long)in_EDX
                         );
      *(value_type *)(in_RSI + 0xb8) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0xd8),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0xba) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x40) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x90),(long)in_EDX
                         );
      *(value_type *)(in_RSI + 0x46) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x90),(long)in_ECX
                         );
      *(value_type *)(in_RSI + 0x48) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x2000) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x138),
                          (long)in_EDX);
      *(value_type *)(in_RSI + 0xd0) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x138),
                          (long)in_ECX);
      *(value_type *)(in_RSI + 0xd2) = *pvVar3;
    }
    if ((*(uint *)(in_RDI + 6) & 0x4000) != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x150),
                          (long)in_EDX);
      *(value_type *)(in_RSI + 0xbc) = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI[3] + 0x150),
                          (long)in_ECX);
      *(value_type *)(in_RSI + 0xbe) = *pvVar3;
    }
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::fillInteractionData(InteractionData& idat,
                                                     int atom1, int atom2,
                                                     bool newAtom1) {
    idat.excluded = excludeAtomPair(atom1, atom2);

    if (newAtom1) {
#ifdef IS_MPI
      idat.atid1 = identsRow[atom1];
      idat.atid2 = identsCol[atom2];

      if (regionsRow[atom1] >= 0 && regionsCol[atom2] >= 0) {
        idat.sameRegion = (regionsRow[atom1] == regionsCol[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A1 = atomRowData.aMat[atom1];
        idat.A2 = atomColData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t1 = atomRowData.torque[atom1];
        idat.t2 = atomColData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_1 = atomRowData.dipole[atom1];
        idat.D_2 = atomColData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_1 = atomRowData.quadrupole[atom1];
        idat.Q_2 = atomColData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho1 = atomRowData.density[atom1];
        idat.rho2 = atomColData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho1 = atomRowData.functional[atom1];
        idat.frho2 = atomColData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho1 = atomRowData.functionalDerivative[atom1];
        idat.dfrho2 = atomColData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot1 = atomRowData.particlePot[atom1];
        idat.particlePot2 = atomColData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge1 = atomRowData.skippedCharge[atom1];
        idat.skippedCharge2 = atomColData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ1 = atomRowData.flucQPos[atom1];
        idat.flucQ2 = atomColData.flucQPos[atom2];
      }

#else

      idat.atid1 = idents[atom1];
      idat.atid2 = idents[atom2];

      if (regions[atom1] >= 0 && regions[atom2] >= 0) {
        idat.sameRegion = (regions[atom1] == regions[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A1 = snap_->atomData.aMat[atom1];
        idat.A2 = snap_->atomData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t1 = snap_->atomData.torque[atom1];
        idat.t2 = snap_->atomData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_1 = snap_->atomData.dipole[atom1];
        idat.D_2 = snap_->atomData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_1 = snap_->atomData.quadrupole[atom1];
        idat.Q_2 = snap_->atomData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho1 = snap_->atomData.density[atom1];
        idat.rho2 = snap_->atomData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho1 = snap_->atomData.functional[atom1];
        idat.frho2 = snap_->atomData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho1 = snap_->atomData.functionalDerivative[atom1];
        idat.dfrho2 = snap_->atomData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot1 = snap_->atomData.particlePot[atom1];
        idat.particlePot2 = snap_->atomData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge1 = snap_->atomData.skippedCharge[atom1];
        idat.skippedCharge2 = snap_->atomData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ1 = snap_->atomData.flucQPos[atom1];
        idat.flucQ2 = snap_->atomData.flucQPos[atom2];
      }
#endif

    } else {
      // atom1 is not new, so don't bother updating properties of that atom:
#ifdef IS_MPI
      idat.atid2 = identsCol[atom2];

      if (regionsRow[atom1] >= 0 && regionsCol[atom2] >= 0) {
        idat.sameRegion = (regionsRow[atom1] == regionsCol[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A2 = atomColData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t2 = atomColData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_2 = atomColData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_2 = atomColData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho2 = atomColData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho2 = atomColData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho2 = atomColData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot2 = atomColData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge2 = atomColData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ2 = atomColData.flucQPos[atom2];
      }

#else
      idat.atid2 = idents[atom2];

      if (regions[atom1] >= 0 && regions[atom2] >= 0) {
        idat.sameRegion = (regions[atom1] == regions[atom2]);
      } else {
        idat.sameRegion = false;
      }

      if (atomStorageLayout_ & DataStorage::dslAmat) {
        idat.A2 = snap_->atomData.aMat[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslTorque) {
        idat.t2 = snap_->atomData.torque[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDipole) {
        idat.D_2 = snap_->atomData.dipole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
        idat.Q_2 = snap_->atomData.quadrupole[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslDensity) {
        idat.rho2 = snap_->atomData.density[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctional) {
        idat.frho2 = snap_->atomData.functional[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
        idat.dfrho2 = snap_->atomData.functionalDerivative[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslParticlePot) {
        idat.particlePot2 = snap_->atomData.particlePot[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
        idat.skippedCharge2 = snap_->atomData.skippedCharge[atom2];
      }

      if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
        idat.flucQ2 = snap_->atomData.flucQPos[atom2];
      }

#endif
    }
  }